

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O1

void __thiscall duckdb::BaseStatistics::BaseStatistics(BaseStatistics *this,BaseStatistics *other)

{
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics>,_false> __tmp;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_38;
  
  LogicalType::LogicalType(&this->type);
  (this->child_stats).
  super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl = (BaseStatistics *)0x0;
  ::std::swap<duckdb::LogicalType>(&this->type,&other->type);
  this->has_null = other->has_null;
  this->has_no_null = other->has_no_null;
  this->distinct_count = other->distinct_count;
  uVar2 = *(undefined8 *)((long)&other->stats_union + 8);
  uVar3 = *(undefined8 *)((long)&other->stats_union + 0x10);
  uVar4 = *(undefined8 *)((long)&other->stats_union + 0x18);
  *(undefined8 *)(this->stats_union).string_data.min =
       *(undefined8 *)(other->stats_union).string_data.min;
  *(undefined8 *)((long)&this->stats_union + 8) = uVar2;
  *(undefined8 *)((long)&this->stats_union + 0x10) = uVar3;
  *(undefined8 *)((long)&this->stats_union + 0x18) = uVar4;
  *(undefined8 *)((long)&this->stats_union + 0x20) =
       *(undefined8 *)((long)&other->stats_union + 0x20);
  local_38._M_head_impl =
       (this->child_stats).
       super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  (this->child_stats).
  super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl = (BaseStatistics *)0x0;
  _Var1._M_head_impl =
       (other->child_stats).
       super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  (other->child_stats).
  super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl = (BaseStatistics *)0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_> *)
        &this->child_stats,_Var1._M_head_impl);
  _Var1._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (BaseStatistics *)0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_> *)
        &other->child_stats,_Var1._M_head_impl);
  ::std::unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
               *)&local_38);
  return;
}

Assistant:

BaseStatistics::BaseStatistics(BaseStatistics &&other) noexcept {
	std::swap(type, other.type);
	has_null = other.has_null;
	has_no_null = other.has_no_null;
	distinct_count = other.distinct_count;
	stats_union = other.stats_union;
	std::swap(child_stats, other.child_stats);
}